

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

void __thiscall spirv_cross::Compiler::update_active_builtins(Compiler *this)

{
  SPIRFunction *func;
  ActiveBuiltinHandler handler;
  OpcodeHandler local_20;
  Compiler *local_18;
  
  (this->active_input_builtins).lower = 0;
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->active_input_builtins).higher._M_h);
  (this->active_output_builtins).lower = 0;
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->active_output_builtins).higher._M_h);
  this->clip_distance_count = 0;
  this->cull_distance_count = 0;
  local_20._vptr_OpcodeHandler = (_func_int **)&PTR__OpcodeHandler_0035c618;
  local_18 = this;
  func = Variant::get<spirv_cross::SPIRFunction>
                   ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                    (this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,func,&local_20);
  return;
}

Assistant:

void Compiler::update_active_builtins()
{
	active_input_builtins.reset();
	active_output_builtins.reset();
	cull_distance_count = 0;
	clip_distance_count = 0;
	ActiveBuiltinHandler handler(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);
}